

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::stmt_set_left(AssignStmt *stmt,Var *target,Var *new_var)

{
  VarType VVar1;
  InternalException *this;
  Var **var;
  string local_48;
  allocator<char> local_21;
  
  var = &stmt->left_;
  VVar1 = stmt->left_->type_;
  if (VVar1 < Parameter) {
    if ((0x19U >> (VVar1 & 0x1f) & 1) != 0) {
      if (stmt->left_ == target) {
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &new_var->super_enable_shared_from_this<kratos::Var>);
        *var = (Var *)local_48._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
        (*((*var)->super_IRNode)._vptr_IRNode[0x14])(*var,new_var);
        return;
      }
      this = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Target not found",&local_21);
      InternalException::InternalException(this,&local_48);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  change_var_parent(var,target,new_var);
  return;
}

Assistant:

void stmt_set_left(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &left = stmt->left();
    if (left->type() == VarType::Base || left->type() == VarType::PortIO ||
        left->type() == VarType::ConstValue) {
        if (left == target) {
            stmt->set_left(new_var->shared_from_this());
            left->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else {
        change_var_parent(left, target, new_var);
    }
}